

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_then_execute.cpp
# Opt level: O2

void test_then_execute<has_then_execute_free_function>(has_then_execute_free_function *exec)

{
  uint __line;
  int iVar1;
  has_then_execute_free_function *__stat_loc;
  char *__assertion;
  executor_future_t<has_then_execute_free_function,_typename_std::result_of<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_jaredhoberock[P]future_test_then_execute_cpp:88:75)_(future_result_t<future<int>_>_&)>::type>
  result_future;
  int result;
  future<int> predecessor_future;
  element_type *local_20;
  
  std::
  async<test_then_execute<has_then_execute_free_function>(has_then_execute_free_function_const&)::_lambda()_1_>
            ((anon_class_1_0_00000001_for__M_head_impl *)&predecessor_future);
  then_execute<test_then_execute<has_then_execute_free_function>(has_then_execute_free_function_const&)::_lambda(int&)_1_,int>
            ((has_then_execute_free_function *)&result_future,
             (anon_class_1_0_00000001_for_func *)exec,(future<int> *)&local_20);
  iVar1 = std::future<int>::get(&result_future);
  if (iVar1 == 2) {
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&result_future.super___basic_future<int>._M_state.
                super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&predecessor_future.super___basic_future<int>._M_state.
                super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::
    async<test_then_execute<has_then_execute_free_function>(has_then_execute_free_function_const&)::_lambda()_2_>
              ((anon_class_1_0_00000001_for__M_head_impl *)&predecessor_future);
    then_execute<test_then_execute<has_then_execute_free_function>(has_then_execute_free_function_const&)::_lambda()_3_>
              ((has_then_execute_free_function *)&result_future,
               (anon_class_1_0_00000001_for_func *)exec,(future<void> *)&local_20);
    iVar1 = std::future<int>::get(&result_future);
    if (iVar1 == 1) {
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&result_future.super___basic_future<int>._M_state.
                  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&predecessor_future.super___basic_future<int>._M_state.
                  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::
      async<test_then_execute<has_then_execute_free_function>(has_then_execute_free_function_const&)::_lambda()_4_>
                ((anon_class_1_0_00000001_for__M_head_impl *)&predecessor_future);
      result = 0;
      __stat_loc = exec;
      local_20 = (element_type *)&result;
      then_execute<test_then_execute<has_then_execute_free_function>(has_then_execute_free_function_const&)::_lambda(int&)_2_,int>
                ((has_then_execute_free_function *)&result_future,
                 (anon_class_8_1_6971b95b_for_func *)exec,(future<int> *)&local_20);
      std::__basic_future<void>::wait((__basic_future<void> *)&result_future,__stat_loc);
      if (result == 1) {
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&result_future.super___basic_future<int>._M_state.
                    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&predecessor_future.super___basic_future<int>._M_state.
                    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount);
        std::
        async<test_then_execute<has_then_execute_free_function>(has_then_execute_free_function_const&)::_lambda()_5_>
                  ((anon_class_1_0_00000001_for__M_head_impl *)&predecessor_future);
        result = 0;
        local_20 = (element_type *)&result;
        then_execute<test_then_execute<has_then_execute_free_function>(has_then_execute_free_function_const&)::_lambda()_6_>
                  ((has_then_execute_free_function *)&result_future,
                   (anon_class_8_1_f8e7f5fd_for_func *)exec,(future<void> *)&local_20);
        std::__basic_future<void>::wait((__basic_future<void> *)&result_future,exec);
        if (result == 0xd) {
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&result_future.super___basic_future<int>._M_state.
                      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&predecessor_future.super___basic_future<int>._M_state.
                      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount);
          return;
        }
        __assert_fail("13 == expect_thirteen",
                      "/workspace/llm4binary/github/license_c_cmakelists/jaredhoberock[P]future/test_then_execute.cpp"
                      ,0x91,
                      "void test_then_execute(const Executor &) [Executor = has_then_execute_free_function]"
                     );
      }
      __assertion = "1 == result";
      __line = 0x7f;
    }
    else {
      __assertion = "1 == result_future.get()";
      __line = 0x6d;
    }
  }
  else {
    __assertion = "2 == result_future.get()";
    __line = 0x5f;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/jaredhoberock[P]future/test_then_execute.cpp"
                ,__line,
                "void test_then_execute(const Executor &) [Executor = has_then_execute_free_function]"
               );
}

Assistant:

void test_then_execute(const Executor& exec)
{
  {
    // non-void predecessor to non-void result

    std::future<int> predecessor_future = std::async([] { return 1; });

    auto result_future = std::experimental::execution::then_execute(exec, [](int& predecessor)
    {
      return 1 + predecessor;
    },
    predecessor_future
    );

    assert(2 == result_future.get());
  }

  {
    // void predecessor to non-void result
    std::future<void> predecessor_future = std::async([]{});

    auto result_future = std::experimental::execution::then_execute(exec, []
    {
      return 1;
    },
    predecessor_future
    );

    assert(1 == result_future.get());
  }

  {
    // non-void predecessor_future to void result

    std::future<int> predecessor_future = std::async([] { return 1; });

    int result = 0;
    auto result_future = std::experimental::execution::then_execute(exec, [&](int& predecessor)
    {
      result = predecessor;
    },
    predecessor_future
    );

    result_future.wait();

    assert(1 == result);
  }

  {
    // void predecessor_future to void result

    std::future<void> predecessor_future = std::async([]{});

    int expect_thirteen = 0;
    auto result_future = std::experimental::execution::then_execute(exec, [&]
    {
      expect_thirteen = 13;
    },
    predecessor_future
    );

    result_future.wait();

    assert(13 == expect_thirteen);
  }
}